

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O2

void __thiscall
NetworkNS::cb3D_integrator::cb3D_integrator
          (cb3D_integrator *this,NetwMin *init_net,double temperature,double slipspring_rate)

{
  size_t __size;
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int *piVar6;
  double **ppdVar7;
  ostream *poVar8;
  Network *pNVar9;
  Hopping *this_00;
  ulong uVar10;
  uint uVar11;
  _List_node_base *p_Var12;
  uint uVar13;
  uint uVar14;
  uint i;
  size_t __size_00;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  this->cur_bd_net = init_net;
  this->bd_cur_step = 0;
  uVar10 = (init_net->network->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl.
           _M_node._M_size;
  uVar11 = (uint)uVar10;
  this->dofs = uVar11;
  uVar11 = uVar11 * 3;
  this->dofs_3N = uVar11;
  uVar10 = uVar10 & 0xffffffff;
  __size = uVar10 * 8;
  pdVar5 = (double *)malloc(__size);
  this->xshift = pdVar5;
  pdVar5 = (double *)malloc(__size);
  this->yshift = pdVar5;
  pdVar5 = (double *)malloc(__size);
  this->zshift = pdVar5;
  piVar6 = (int *)malloc(uVar10 * 4);
  this->grid_cell = piVar6;
  __size_00 = (ulong)uVar11 << 3;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_x = pdVar5;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_x_ps = pdVar5;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_mass = pdVar5;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_f = pdVar5;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_f_ps = pdVar5;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_nb_f = pdVar5;
  pdVar5 = (double *)malloc(__size_00);
  this->bd_gamma = pdVar5;
  ppdVar7 = (double **)malloc(__size);
  this->bd_stress = ppdVar7;
  for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
    pdVar5 = (double *)malloc(0x30);
    this->bd_stress[uVar15] = pdVar5;
  }
  this->bd_temp = temperature;
  dVar16 = pow(10.0,607.5 / (temperature + -211.15 + 45.0) + -10.4);
  dVar17 = (dVar16 * 0.001) / 1.1311591129852e-25;
  pNVar9 = this->cur_bd_net->network;
  pdVar5 = this->bd_x;
  pdVar2 = this->bd_x_ps;
  pdVar3 = this->bd_gamma;
  pdVar4 = this->bd_mass;
  uVar11 = 2;
  p_Var12 = (_List_node_base *)&pNVar9->nodes;
  while (p_Var12 = (((_List_base<sNode,_std::allocator<sNode>_> *)&p_Var12->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next,
        p_Var12 != (_List_node_base *)&pNVar9->nodes) {
    uVar13 = uVar11 - 2;
    pdVar5[uVar13] = (double)*(_List_node_base **)((long)(p_Var12 + 1) + 8);
    uVar14 = uVar11 - 1;
    pdVar5[uVar14] = *(double *)(p_Var12 + 2);
    pdVar5[uVar11] = *(double *)((long)(p_Var12 + 2) + 8);
    pdVar2[uVar13] = (double)*(_List_node_base **)((long)(p_Var12 + 1) + 8);
    pdVar2[uVar14] = *(double *)(p_Var12 + 2);
    pdVar2[uVar11] = *(double *)((long)(p_Var12 + 2) + 8);
    dVar1 = *(double *)(p_Var12 + 10);
    pdVar4[uVar13] = dVar1;
    pdVar4[uVar14] = dVar1;
    pdVar4[uVar11] = *(double *)(p_Var12 + 10);
    pdVar3[uVar13] = dVar17;
    pdVar3[uVar14] = dVar17;
    pdVar3[uVar11] = dVar17;
    uVar11 = uVar11 + 3;
  }
  dVar17 = *pdVar4;
  dVar1 = *pdVar3;
  this->gamma_mass_opt = true;
  uVar10 = 1;
  dVar17 = dVar17 * dVar1;
  do {
    if (this->dofs_3N <= uVar10) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "#:\n#: Brownian Dynamics integrator will run in the optimized way.\n"
                              );
      poVar8 = std::operator<<(poVar8,
                               "#: --- All beads have the same mass and friction coefficient.\n");
      std::operator<<(poVar8,"#: --- The monomeric friction coefficient is ");
      poVar8 = std::ostream::_M_insert<double>(dVar16 * 0.001);
      poVar8 = std::operator<<(poVar8," kg/s.\n");
      std::operator<<(poVar8,"#: --- The friction coefficient is ");
      poVar8 = std::ostream::_M_insert<double>(*this->bd_gamma);
      poVar8 = std::operator<<(poVar8," s^{-1}.\n");
      std::operator<<(poVar8,"#: --- The bead friction coefficient is ");
      poVar8 = std::ostream::_M_insert<double>(*this->bd_mass * *this->bd_gamma * 1.660538921e-27);
      poVar8 = std::operator<<(poVar8," kg/s.\n");
      std::operator<<(poVar8,"#: --- The expected Rouse diffusivity multiplied by N would be: ");
      poVar8 = std::ostream::_M_insert<double>
                         ((((this->bd_temp * 1.3806488e-23) / *this->bd_mass) / *this->bd_gamma) /
                          1.660538921e-27);
      poVar8 = std::operator<<(poVar8," m^2/s.\n#:");
      std::endl<char,std::char_traits<char>>(poVar8);
      pNVar9 = this->cur_bd_net->network;
LAB_00103ec8:
      if ((pNVar9->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
          _M_node._M_size != 0) {
        this_00 = (Hopping *)operator_new(0x408);
        Hopping::Hopping(this_00,slipspring_rate);
        this->my_hopping_scheme = this_00;
      }
      return;
    }
    pdVar5 = pdVar3 + uVar10;
    pdVar2 = pdVar4 + uVar10;
    dVar17 = *pdVar5 * *pdVar2 - dVar17;
    if (0.0001 <= dVar17 * dVar17) {
      this->gamma_mass_opt = false;
      goto LAB_00103ec8;
    }
    uVar10 = uVar10 + 1;
    dVar17 = *pdVar5 * *pdVar2;
  } while( true );
}

Assistant:

cb3D_integrator::cb3D_integrator(class NetwMin *init_net, double temperature, double slipspring_rate) {
      
      
      cur_bd_net = init_net;
      bd_cur_step = 0;
      dofs = cur_bd_net->network->nodes.size();
      dofs_3N = 3 * dofs;
      
      xshift = (double*)malloc(dofs*sizeof(double));
      yshift = (double*)malloc(dofs*sizeof(double));
      zshift = (double*)malloc(dofs*sizeof(double));
      grid_cell = (int*)malloc(dofs*sizeof(int));

      bd_x = (double*) malloc(dofs_3N * sizeof (double));
      bd_x_ps = (double*) malloc(dofs_3N * sizeof (double));
      bd_mass = (double*) malloc(dofs_3N * sizeof (double));
      bd_f = (double*) malloc(dofs_3N * sizeof (double));
      bd_f_ps = (double*) malloc(dofs_3N * sizeof (double));
      bd_nb_f = (double*) malloc(dofs_3N * sizeof (double));
      bd_gamma = (double*) malloc(dofs_3N * sizeof (double));
      
      
      bd_stress = (double**)malloc(dofs * sizeof(double*));
      for(unsigned int i = 0; i < dofs; i++)
         bd_stress[i] = (double*)malloc(6*sizeof(double));
      
      
      // Set the temperature:
      bd_temp = temperature;

      double gamma;
      unsigned int inode = 0;


      /** Klopffer et al. (\a Polymer \b 1998, \a 39, 3445 - 3449) have characterized the 
       *  rheological behavior of a series of polybutadienes and polyisoprenes over a wide
       *  range of temperatures. The viscoelastic coefficients resulting from the time-
       *  temperature superposition principle were determined. The Rouse theory modified for 
       *  undiluted polymers was used to calculate the monomeric friction coefficient, 
       *  @f$ \zeta_0@f$ from the transition zone.
       *  It was concluded that, within experimental error, a single set of WLF parameters at
       *  @f$ T_{\rm g}@f$ was adequate to characterize the relaxation dynamics irrespective of
       *  the vinyl content of the polybutadienes and polyisoprenes. 
       */

      /** The monomeric friction coefficient, @f$\zeta_0 @f$, characterizes the resistance 
       * encountered by a monomer unit moving through its surroundings. It has been shown to follow 
       * the WLF law. The variation of the monomeric friction coefficient with temperature is: 
       * @f[ \log{\zeta_0 \left(T\right)} = \log{\zeta_\infty} + \frac{C_1^{\rm g}C_2^{\rm g}}
       *    {T-T_{\rm g} + C_2^{\rm g}} @f]
       * with the parameters @f$ C_1^{\rm g} = 13.5 \pm 0.2 @f$, 
       * @f$ C_2^{\rm g} = 45 \pm 3 \;{\rm K}@f$, 
       * @f$ \log{\zeta_\infty} = -10.4 \;{\rm dyn\;s\;cm}^{-1}@f$ 
       * and @f$ T_{\rm g} = 211.15 \;{\rm K} @f$. 
       * At a temperature of 298 K, 
       * @f$\zeta_0(298\:{\rm K}) = 1.61 \times 10^{-6} \;{\rm dyn\;s\;cm}^{-1}@f$, while
       * at a temperature of  500 K,
       * @f$\zeta_0(500\:{\rm K}) = 2.63 \times 10^{-9} \;{\rm dyn\;s\;cm}^{-1}
       * = 2.63 \times 10^{-12} \;{\rm kg/s}@f$.
       */

      // Monomeric friction coefficient in  kg/s
      double monomeric_friction = 1.e-3 * pow(10.0, ((13.5 * 45.0)/(bd_temp-211.15+45)-10.4)); 
      
      /** The @f$\zeta @f$ parameter refers to a monomer of PI moving through its environment. 
       *  Since, we are dealing with larger entities, we analyze it as:
       * @f[ \zeta_0 \left(T\right) = \gamma\left(T\right) \cdot m_{\rm monomer} @f]
       * where @f$ \gamma (T)@f$ is measured in @f$ {\rm s}^{-1} @f$ and can be then multiplied by 
       * the mass of the Brownian bead which consists of several PI monomers.
       */

      // convert monomeric friction coefficient (kg/s) to g/mol/s and then divide it with the mass 
      // of a PI monomer 
      gamma = monomeric_friction / (pi_monomer_mass * amu_to_kg); // s^{-1}

      for (std::list<tNode>::iterator it = cur_bd_net->network->nodes.begin();
              it != cur_bd_net->network->nodes.end(); ++it) {

         // positions in A
         bd_x[3 * inode + 0] = (*it).Pos[0];
         bd_x[3 * inode + 1] = (*it).Pos[1];
         bd_x[3 * inode + 2] = (*it).Pos[2];

         // positions in A
         bd_x_ps[3 * inode + 0] = (*it).Pos[0];
         bd_x_ps[3 * inode + 1] = (*it).Pos[1];
         bd_x_ps[3 * inode + 2] = (*it).Pos[2];

         // mass of nodal points in g/mol
         bd_mass[3 * inode + 0] = (*it).mass;
         bd_mass[3 * inode + 1] = (*it).mass;
         bd_mass[3 * inode + 2] = (*it).mass;

         // All gamma are measured in s^{-1}
         bd_gamma[3 * inode + 0] = gamma;
         bd_gamma[3 * inode + 1] = gamma;
         bd_gamma[3 * inode + 2] = gamma;

         inode++;
      }

      
      /* Check whether all beads have the same mass and the same friction coefficient. */
      double prev_val = bd_mass[0] * bd_gamma[0];
      gamma_mass_opt = true;
      for (inode = 1; inode < dofs_3N; inode++){
         if ( ((bd_mass[inode]*bd_gamma[inode])-prev_val)
             *((bd_mass[inode]*bd_gamma[inode])-prev_val) >= tol){
            gamma_mass_opt = false;
            break;
         }
         else
            prev_val = bd_mass[inode]*bd_gamma[inode];
      }
      
      if (gamma_mass_opt) 
         cout << "#:\n#: Brownian Dynamics integrator will run in the optimized way.\n"
              << "#: --- All beads have the same mass and friction coefficient.\n" 
              << "#: --- The monomeric friction coefficient is " << monomeric_friction << " kg/s.\n"
              << "#: --- The friction coefficient is " << bd_gamma[0] << " s^{-1}.\n" 
              << "#: --- The bead friction coefficient is " << bd_mass[0]*bd_gamma[0]*amu_to_kg 
              << " kg/s.\n" 
              << "#: --- The expected Rouse diffusivity multiplied by N would be: " 
              << boltz_const_Joule_K * bd_temp / bd_mass[0] / bd_gamma[0] / amu_to_kg 
              << " m^2/s.\n#:"<< endl;
      
      // Initialize the coupled hopping scheme:
      // Here we can input the zeta parameter...
      if (cur_bd_net->network->pslip_springs.size() > 0)
         my_hopping_scheme = new Hopping(slipspring_rate);
            
      return;
   }